

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_readdir(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 *puVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  char *local_58;
  int rc;
  io_private *pDev;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar2 = jx9_value_is_resource(*apArg), iVar2 == 0)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
    jx9_result_bool(pCtx,0);
  }
  else {
    plVar3 = (long *)jx9_value_to_resource(*apArg);
    if ((plVar3 == (long *)0x0) || (*(int *)((long)plVar3 + 0x34) != 0xfeac14)) {
      jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
      jx9_result_bool(pCtx,0);
    }
    else {
      puVar1 = (undefined8 *)*plVar3;
      if ((puVar1 == (undefined8 *)0x0) || (puVar1[7] == 0)) {
        pcVar4 = jx9_function_name(pCtx);
        if (puVar1 == (undefined8 *)0x0) {
          local_58 = "null_stream";
        }
        else {
          local_58 = (char *)*puVar1;
        }
        jx9_context_throw_error_format
                  (pCtx,2,
                   "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                   ,pcVar4,local_58);
        jx9_result_bool(pCtx,0);
      }
      else {
        jx9_result_bool(pCtx,0);
        iVar2 = (*(code *)puVar1[7])(plVar3[1]);
        if (iVar2 != 0) {
          jx9_result_bool(pCtx,0);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_readdir(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	int rc;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xReadDir == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	jx9_result_bool(pCtx, 0);
	/* Perform the requested operation */
	rc = pStream->xReadDir(pDev->pHandle, pCtx);
	if( rc != JX9_OK ){
		/* Return FALSE */
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}